

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value-eval-util.hh
# Opt level: O3

vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> * __thiscall
tinyusdz::lerp<std::array<double,3ul>>
          (vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
           *__return_storage_ptr__,tinyusdz *this,
          vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *a,
          vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_> *b,double t)

{
  double *pdVar1;
  double *pdVar2;
  double *pdVar3;
  double dVar4;
  double dVar5;
  pointer paVar6;
  pointer paVar7;
  double dVar8;
  double dVar9;
  ulong uVar10;
  long lVar11;
  ulong __new_size;
  double dVar12;
  
  (__return_storage_ptr__->
  super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar10 = (*(long *)(this + 8) - *(long *)this >> 3) * -0x5555555555555555;
  __new_size = ((long)(a->
                      super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(a->
                      super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  if (uVar10 <= __new_size) {
    __new_size = uVar10;
  }
  if (__new_size != 0) {
    ::std::vector<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>::resize
              (__return_storage_ptr__,__new_size);
    if (*(long *)(this + 8) - *(long *)this ==
        (long)(a->
              super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
              )._M_impl.super__Vector_impl_data._M_finish -
        (long)(a->
              super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
              )._M_impl.super__Vector_impl_data._M_start) {
      dVar12 = 1.0 - t;
      lVar11 = 0x10;
      do {
        paVar6 = (a->
                 super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        dVar4 = *(double *)(*(long *)this + lVar11);
        dVar5 = *(double *)((long)paVar6->_M_elems + lVar11);
        paVar7 = (__return_storage_ptr__->
                 super__Vector_base<std::array<double,_3UL>,_std::allocator<std::array<double,_3UL>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        pdVar1 = (double *)(*(long *)this + -0x10 + lVar11);
        dVar8 = pdVar1[1];
        pdVar2 = (double *)((long)paVar6->_M_elems + lVar11 + -0x10);
        dVar9 = pdVar2[1];
        pdVar3 = (double *)((long)paVar7->_M_elems + lVar11 + -0x10);
        *pdVar3 = *pdVar2 * t + *pdVar1 * dVar12;
        pdVar3[1] = dVar9 * t + dVar8 * dVar12;
        *(double *)((long)paVar7->_M_elems + lVar11) = dVar5 * t + dVar4 * dVar12;
        lVar11 = lVar11 + 0x18;
        __new_size = __new_size - 1;
      } while (__new_size != 0);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<T> lerp(const std::vector<T> &a, const std::vector<T> &b,
                           const double t) {
  std::vector<T> dst;

  // Choose shorter one
  size_t n = std::min(a.size(), b.size());
  if (n == 0) {
    return dst;
  }

  dst.resize(n);

  if (a.size() != b.size()) {
    return dst;
  }
  for (size_t i = 0; i < n; i++) {
    dst[i] = lerp(a[i], b[i], t);
  }

  return dst;
}